

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

mcpl_file_t mcpl_actual_open_file(char *filename,int *repair_status)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  mcpl_fileinternal_t *f;
  char *pcVar4;
  FILE *__stream;
  ulong uVar5;
  gzFile pgVar6;
  size_t sVar7;
  uint64_t uVar8;
  char **ppcVar9;
  uint64_t uVar10;
  uint32_t *puVar11;
  mcpl_particle_t *pmVar12;
  ulong extraout_RAX;
  mcpl_file_t mVar13;
  long lVar14;
  long lVar15;
  uchar start [8];
  uint32_t arr [8];
  uint64_t numpart;
  char testbuf [4];
  undefined8 uStack_90;
  int local_80;
  byte local_7c;
  byte local_7b;
  byte local_7a;
  char local_79;
  int *local_78;
  int local_6c;
  mcu8str local_68;
  uint local_50;
  int local_4c;
  uint64_t local_40;
  undefined1 local_34 [4];
  
  iVar1 = *repair_status;
  *repair_status = 0;
  local_78 = repair_status;
  if (filename == (char *)0x0) {
    pcVar4 = "mcpl_open_file called with null string";
    goto LAB_00104632;
  }
  uStack_90 = (code *)0x1040c8;
  f = (mcpl_fileinternal_t *)mcpl_internal_calloc(1,0x100);
  f->file = (FILE *)0x0;
  f->filegz = (gzFile)0x0;
  uStack_90 = (code *)0x1040e0;
  pcVar4 = strrchr(filename,0x2e);
  if (pcVar4 == (char *)0x0) {
LAB_001040f8:
    uStack_90 = (code *)0x104108;
    mcu8str_view_cstr(&local_68,filename);
    uStack_90 = (code *)0x104117;
    __stream = (FILE *)mctools_fopen(&local_68,"rb");
    f->file = (FILE *)__stream;
    if (__stream != (FILE *)0x0) {
      pgVar6 = f->filegz;
      if (pgVar6 != (gzFile)0x0) goto LAB_00104164;
      uStack_90 = (code *)0x104143;
      uVar5 = fread(&local_80,1,8,__stream);
LAB_00104175:
      if (3 < uVar5) {
        if (local_80 != 0x4c50434d) {
          pcVar4 = "File is not an MCPL file!";
          goto LAB_00104632;
        }
        if (uVar5 == 8) {
          iVar3 = (uint)local_7c * 100 + ((uint)local_7b + (uint)local_7b * 4) * 2;
          f->format_version = ((uint)local_7a + iVar3) - 0x14d0;
          if ((iVar3 + (uint)local_7a & 0xfffffffe) != 0x14d2) {
            pcVar4 = "File is in an unsupported MCPL version!";
            goto LAB_00104632;
          }
          local_68.c_str._0_4_ = 0x1234567;
          f->is_little_endian = 1;
          if (local_79 != 'L') {
            if (local_79 == 'B') {
              pcVar4 = 
              "Endian-ness of current platform is different than the one used to write the file.";
            }
            else {
              pcVar4 = "Unexpected value in endianness field!";
            }
            goto LAB_00104632;
          }
          if (f->filegz == (gzFile)0x0) {
            uStack_90 = (code *)0x10421b;
            sVar7 = fread(&local_40,1,8,(FILE *)f->file);
          }
          else {
            uStack_90 = (code *)0x104200;
            iVar3 = gzread(f->filegz,&local_40,8);
            sVar7 = (size_t)iVar3;
          }
          if (sVar7 == 8) {
            f->nparticles = local_40;
            if (f->filegz == (gzFile)0x0) {
              uStack_90 = (code *)0x104261;
              sVar7 = fread(&local_68,1,0x20,(FILE *)f->file);
            }
            else {
              uStack_90 = (code *)0x104246;
              iVar3 = gzread(f->filegz,&local_68,0x20);
              sVar7 = (size_t)iVar3;
            }
            if (sVar7 == 0x20) {
              f->ncomments = (uint32_t)local_68.c_str;
              f->nblobs = local_68.c_str._4_4_;
              f->opt_userflags = local_68.size;
              f->opt_polarisation = local_68.buflen;
              f->opt_singleprec = local_68.owns_memory;
              f->opt_universalpdgcode = local_68._20_4_;
              f->particle_size = local_50;
              if (0x60 < local_50) {
                pcVar4 = "unexpected particle size";
                goto LAB_00104632;
              }
              if (local_4c == 0) {
                lVar14 = 0x30;
              }
              else {
                if (f->filegz == (gzFile)0x0) {
                  uStack_90 = (code *)0x1042e7;
                  sVar7 = fread(&f->opt_universalweight,1,8,(FILE *)f->file);
                }
                else {
                  uStack_90 = (code *)0x1042c6;
                  iVar3 = gzread(f->filegz,&f->opt_universalweight,8);
                  sVar7 = (size_t)iVar3;
                }
                if (sVar7 != 8) goto LAB_001045d6;
                local_68.owns_memory = f->opt_singleprec;
                local_68.size = f->opt_userflags;
                local_68.buflen = f->opt_polarisation;
                local_68._20_4_ = f->opt_universalpdgcode;
                lVar14 = 0x38;
              }
              f->opt_signature =
                   local_68.size * 0x10 +
                   local_68.owns_memory + local_68.buflen * 2 + (uint)(local_68._20_4_ != 0) * 4 +
                   (-(uint)(f->opt_universalweight != 0.0) & 1) * 8;
              uStack_90 = (code *)0x104346;
              uVar8 = mcpl_read_string(f,&f->hdr_srcprogname,
                                       "Errors encountered while attempting to read header");
              uVar8 = uVar8 + lVar14;
              local_6c = iVar1;
              if ((ulong)f->ncomments == 0) {
                f->comments = (char **)0x0;
              }
              else {
                uStack_90 = (code *)0x104362;
                ppcVar9 = (char **)mcpl_internal_calloc((ulong)f->ncomments,8);
                f->comments = ppcVar9;
                if (f->ncomments != 0) {
                  lVar14 = 0;
                  uVar5 = 0;
                  do {
                    uStack_90 = (code *)0x10438b;
                    uVar10 = mcpl_read_string(f,(char **)((long)f->comments + lVar14),
                                              "Errors encountered while attempting to read header");
                    uVar8 = uVar8 + uVar10;
                    uVar5 = uVar5 + 1;
                    lVar14 = lVar14 + 8;
                  } while (uVar5 < f->ncomments);
                }
              }
              f->blobkeys = (char **)0x0;
              f->bloblengths = (uint32_t *)0x0;
              f->blobs = (char **)0x0;
              if ((ulong)f->nblobs != 0) {
                uStack_90 = (code *)0x1043ce;
                ppcVar9 = (char **)mcpl_internal_calloc((ulong)f->nblobs,8);
                f->blobs = ppcVar9;
                uStack_90 = (code *)0x1043df;
                ppcVar9 = (char **)mcpl_internal_calloc((ulong)f->nblobs,8);
                f->blobkeys = ppcVar9;
                uStack_90 = (code *)0x1043f0;
                puVar11 = (uint32_t *)mcpl_internal_calloc((ulong)f->nblobs,4);
                f->bloblengths = puVar11;
                if (f->nblobs != 0) {
                  lVar14 = 0;
                  uVar5 = 0;
                  do {
                    uStack_90 = (code *)0x104419;
                    uVar10 = mcpl_read_string(f,(char **)((long)f->blobkeys + lVar14),
                                              "Errors encountered while attempting to read header");
                    uVar8 = uVar8 + uVar10;
                    uVar5 = uVar5 + 1;
                    lVar14 = lVar14 + 8;
                  } while (uVar5 < f->nblobs);
                  if (f->nblobs != 0) {
                    lVar15 = 0;
                    lVar14 = 0;
                    uVar5 = 0;
                    do {
                      uStack_90 = (code *)0x104457;
                      uVar10 = mcpl_read_buffer(f,(uint *)((long)f->bloblengths + lVar14),
                                                (char **)((long)f->blobs + lVar15),
                                                "Errors encountered while attempting to read header"
                                               );
                      uVar8 = uVar8 + uVar10;
                      uVar5 = uVar5 + 1;
                      lVar14 = lVar14 + 4;
                      lVar15 = lVar15 + 8;
                    } while (uVar5 < f->nblobs);
                  }
                }
              }
              uStack_90 = (code *)0x10447c;
              pmVar12 = (mcpl_particle_t *)mcpl_internal_calloc(1,0x68);
              iVar1 = local_6c;
              f->particle = pmVar12;
              f->current_particle_idx = 0;
              f->first_particle_pos = uVar8;
              if (local_6c == 0 && f->nparticles != 0) {
                return (mcpl_file_t)f;
              }
              pgVar6 = f->filegz;
              if (pgVar6 == (gzFile)0x0) {
                if ((FILE *)f->file != (FILE *)0x0) {
                  uStack_90 = (code *)0x1044f5;
                  iVar3 = fseek((FILE *)f->file,0,2);
                  if (iVar3 == 0) {
                    uStack_90 = (code *)0x104505;
                    lVar14 = ftell((FILE *)f->file);
                    uVar5 = lVar14 - f->first_particle_pos;
                    if (uVar5 != 0 && (long)f->first_particle_pos <= lVar14) {
                      uVar5 = uVar5 / f->particle_size;
                      uVar2 = f->nparticles;
                      if (uVar2 != uVar5) {
                        if ((uVar2 != 0) && (uVar2 < uVar5)) {
                          uStack_90 = (code *)0x104675;
                          mcpl_error("Input file has invalid combination of meta-data & filesize.");
LAB_00104675:
                          pcVar4 = "unexpected nparticles value";
                          uStack_90 = mcpl_open_file;
                          mcpl_error("unexpected nparticles value");
                          uStack_90 = (code *)(extraout_RAX & 0xffffffff);
                          mVar13 = mcpl_actual_open_file(pcVar4,(int *)((long)&uStack_90 + 4));
                          return (mcpl_file_t)mVar13.internal;
                        }
                        if (iVar1 == 0) {
                          if (uVar2 != 0) goto LAB_00104675;
                          uStack_90 = (code *)0x1045af;
                          printf("MCPL WARNING: Input file appears to not have been closed properly. Recovered %lu particles.\n"
                                 ,uVar5);
                        }
                        else {
                          *local_78 = 3;
                        }
                        f->nparticles = uVar5;
                      }
                    }
                  }
                }
                uStack_90 = (code *)0x1045c4;
                fseek((FILE *)f->file,f->first_particle_pos,0);
                return (mcpl_file_t)f;
              }
              if (f->nparticles == 0) {
                uStack_90 = (code *)0x104558;
                iVar3 = gzread(pgVar6,local_34,4);
                if (iVar3 != 0) {
                  if (iVar1 == 0) {
                    pcVar4 = 
                    "Input file appears to not have been closed properly and data recovery is disabled for gzipped files."
                    ;
                    goto LAB_00104632;
                  }
                  *local_78 = 1;
                }
                pgVar6 = f->filegz;
                uVar8 = f->first_particle_pos;
              }
              else {
                if (local_6c == 0) {
                  pcVar4 = "logic error (!caller_is_mcpl_repair)";
                  goto LAB_00104632;
                }
                *local_78 = 2;
              }
              uStack_90 = (code *)0x104584;
              uVar10 = gzseek64(pgVar6,uVar8,0);
              if (uVar10 == uVar8) {
                return (mcpl_file_t)f;
              }
              pcVar4 = "Unexpected issue skipping to start of empty gzipped file";
              goto LAB_00104632;
            }
          }
LAB_001045d6:
          pcVar4 = "Errors encountered while attempting to read header";
          goto LAB_00104632;
        }
      }
      pcVar4 = "Error while reading first bytes of file!";
      goto LAB_00104632;
    }
  }
  else {
    uStack_90 = (code *)0x1040f4;
    iVar3 = strcmp(pcVar4,".gz");
    if (iVar3 != 0) goto LAB_001040f8;
    uStack_90 = (code *)0x104154;
    pgVar6 = mcpl_gzopen(filename,"rb");
    f->filegz = pgVar6;
    if (pgVar6 != (gzFile)0x0) {
LAB_00104164:
      uStack_90 = (code *)0x104173;
      iVar3 = gzread(pgVar6,&local_80,8);
      uVar5 = (ulong)iVar3;
      goto LAB_00104175;
    }
  }
  uStack_90 = (code *)0x104607;
  mcpl_internal_cleanup_file(f);
  pcVar4 = "Unable to open file!";
LAB_00104632:
  uStack_90 = (code *)0x104638;
  (*mcpl_error_handler)(pcVar4);
  uStack_90 = (code *)0x10464d;
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  uStack_90 = (code *)0x104657;
  exit(1);
}

Assistant:

MCPL_LOCAL mcpl_file_t mcpl_actual_open_file(const char * filename, int * repair_status)
{
  int caller_is_mcpl_repair = *repair_status;
  *repair_status = 0;//file not broken

  if (!filename)
    mcpl_error("mcpl_open_file called with null string");

  mcpl_platform_compatibility_check();

  mcpl_file_t out;
  out.internal = NULL;

  mcpl_fileinternal_t * f
    = (mcpl_fileinternal_t*)mcpl_internal_calloc(1,sizeof(mcpl_fileinternal_t));

  //open file (with gzopen if filename ends with .gz):
  f->file = NULL;
  f->filegz = NULL;
  const char * lastdot = strrchr(filename, '.');
  if (lastdot && strcmp(lastdot, ".gz") == 0) {
    f->filegz = mcpl_gzopen( filename, "rb" );
    if (!f->filegz) {
      mcpl_internal_cleanup_file(f);
      mcpl_error("Unable to open file!");
    }
  } else {
    f->file = mcpl_internal_fopen(filename,"rb");
    if (!f->file) {
      mcpl_internal_cleanup_file(f);
      mcpl_error("Unable to open file!");
    }
  }

  //First read and check magic word, format version and endianness.
  unsigned char start[8];// = {'M','C','P','L','0','0','0','L'};
  size_t nb;
  if (f->filegz)
    nb = gzread(f->filegz, start, sizeof(start));
  else
    nb = fread(start, 1, sizeof(start), f->file);
  if (nb>=4&&(start[0]!='M'||start[1]!='C'||start[2]!='P'||start[3]!='L'))
    mcpl_error("File is not an MCPL file!");
  if (nb!=sizeof(start))
    mcpl_error("Error while reading first bytes of file!");
  f->format_version = (start[4]-'0')*100 + (start[5]-'0')*10 + (start[6]-'0');
  if (f->format_version!=2&&f->format_version!=3)
    mcpl_error("File is in an unsupported MCPL version!");
  f->is_little_endian = mcpl_platform_is_little_endian();
  if (start[7]!=(f->is_little_endian?'L':'B')) {
    if (start[7]=='L'||start[7]=='B')
      mcpl_error("Endian-ness of current platform is different than the one used to write the file.");
    else
      mcpl_error("Unexpected value in endianness field!");
  }
  int64_t current_pos = sizeof(start);

  //proceed reading header, knowing we have a consistent version and endian-ness.
  const char * errmsg = "Errors encountered while attempting to read header";

  uint64_t numpart;
  if (f->filegz)
    nb = gzread(f->filegz, &numpart, sizeof(numpart));
  else
    nb = fread(&numpart, 1, sizeof(numpart), f->file);
  if (nb!=sizeof(numpart))
    mcpl_error(errmsg);
  current_pos += nb;
  f->nparticles = numpart;

  uint32_t arr[8];
  MCPL_STATIC_ASSERT(sizeof(arr)==32);
  if (f->filegz)
    nb = gzread(f->filegz, arr, sizeof(arr));
  else
    nb=fread(arr, 1, sizeof(arr), f->file);
  if (nb!=sizeof(arr))
    mcpl_error(errmsg);
  current_pos += nb;

  f->ncomments = arr[0];
  f->nblobs = arr[1];
  f->opt_userflags = arr[2];
  f->opt_polarisation = arr[3];
  f->opt_singleprec = arr[4];
  f->opt_universalpdgcode = (int32_t)arr[5];
  f->particle_size = arr[6];//We could check consistency here with the calculated value.
  if ( ! (f->particle_size<=MCPLIMP_MAX_PARTICLE_SIZE) )
    mcpl_error("unexpected particle size");

  if (arr[7]) {
    //file has universal weight
    if (f->filegz)
      nb = gzread(f->filegz, (void*)&(f->opt_universalweight), sizeof(f->opt_universalweight));
    else
      nb=fread((void*)&(f->opt_universalweight), 1, sizeof(f->opt_universalweight), f->file);
    if (nb!=sizeof(f->opt_universalweight))
      mcpl_error(errmsg);
    current_pos += nb;
  }

  f->opt_signature = 0
    + 1 * f->opt_singleprec
    + 2 * f->opt_polarisation
    + 4 * (f->opt_universalpdgcode?1:0)
    + 8 * (f->opt_universalweight?1:0)
    + 16 * f->opt_userflags;

  //Then some strings:
  current_pos += mcpl_read_string(f,&f->hdr_srcprogname,errmsg);
  f->comments = ( f->ncomments
                  ? (char **)mcpl_internal_calloc(f->ncomments,sizeof(char*))
                  : NULL );
  uint32_t i;
  for (i = 0; i < f->ncomments; ++i)
    current_pos += mcpl_read_string(f,&(f->comments[i]),errmsg);

  f->blobkeys = NULL;
  f->bloblengths = 0;
  f->blobs = NULL;
  if (f->nblobs) {
    f->blobs = (char **)mcpl_internal_calloc(f->nblobs,sizeof(char*));
    f->blobkeys = (char **)mcpl_internal_calloc(f->nblobs,sizeof(char*));
    f->bloblengths = (uint32_t *)mcpl_internal_calloc(f->nblobs,sizeof(uint32_t));
    for (i =0; i < f->nblobs; ++i)
      current_pos += mcpl_read_string(f,&(f->blobkeys[i]),errmsg);
    for (i =0; i < f->nblobs; ++i)
      current_pos += mcpl_read_buffer(f, &(f->bloblengths[i]), &(f->blobs[i]), errmsg);
  }
  f->particle = (mcpl_particle_t*)mcpl_internal_calloc(1,sizeof(mcpl_particle_t));

  //At first event now:
  f->current_particle_idx = 0;
  f->first_particle_pos = current_pos;

  if ( f->nparticles==0 || caller_is_mcpl_repair ) {
    //TODO: Perhaps the placeholder nparticles should be UINT64_MAX instead of
    //0, so we know that nparticles=0 is a properly closed file.

    //Although empty files are permitted, it is possible that the file was never
    //closed properly (maybe the writing program ended prematurely). Let us
    //check to possibly recover usage of the file. If caller is mcpl_repair, we
    //always check since the file might have been truncated after it was first
    //closed properly.
    if (f->filegz) {
      //SEEK_END is not supported by zlib, and there is no reliable way to get
      //the input size. Thus, all we can do is to uncompress the whole thing,
      //which we won't since it might stall operations for a long time. But we
      //can at least try to check whether the file is indeed empty or not, and
      //give an error in the latter case:
      if (f->nparticles==0) {
        char testbuf[4];
        nb = gzread(f->filegz, testbuf, sizeof(testbuf));
        if (nb>0) {
          if (caller_is_mcpl_repair) {
            *repair_status = 1;//file broken but can't recover since gzip.
          } else {
            mcpl_error("Input file appears to not have been closed properly"
                       " and data recovery is disabled for gzipped files.");
          }
        }
      } else {
        if (!caller_is_mcpl_repair)
          mcpl_error("logic error (!caller_is_mcpl_repair)");
        *repair_status = 2;//file brokenness can not be determined since gzip.
      }
      if (!mcpl_gzseek( f->filegz, f->first_particle_pos ) )
        mcpl_error("Unexpected issue skipping to start of empty gzipped file");
    } else {
      //SEEK_END is not guaranteed to always work, so we fail our recovery
      //attempt silently:
      if (f->file && !MCPL_FSEEK_END( f->file )) {
        int64_t endpos = MCPL_FTELL(f->file);
        if (endpos > (int64_t)f->first_particle_pos && (uint64_t)endpos != f->first_particle_pos) {
          uint64_t np = ( endpos - f->first_particle_pos ) / f->particle_size;
          if ( f->nparticles != np ) {
            if ( f->nparticles > 0 && np > f->nparticles ) {
              //should really not happen unless file was corrupted or file was
              //first closed properly and then something was appended to it.
              mcpl_error("Input file has invalid combination of meta-data & filesize.");
            }
            if (caller_is_mcpl_repair) {
              *repair_status = 3;//file broken and should be able to repair
            } else {
              if (f->nparticles!=0)
                mcpl_error("unexpected nparticles value");
              printf("MCPL WARNING: Input file appears to not have been"
                     " closed properly. Recovered %" PRIu64 " particles.\n",np);
            }
            f->nparticles = np;
          }
        }
      }
      MCPL_FSEEK( f->file, f->first_particle_pos );//if this fseek failed, it
                                                   //might just be that we are
                                                   //at EOF with no particles.
    }
  }

  out.internal = f;
  return out;
}